

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

vector<signed_char,_std::allocator<signed_char>_> * __thiscall
single_fn::operator()
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,single_fn *this
          ,vector<signed_char,_std::allocator<signed_char>_> *c)

{
  result_type rVar1;
  size_type sVar2;
  element_type *this_00;
  result_type_conflict __n;
  reference pvVar3;
  iterator __first;
  iterator __last;
  value_type local_39;
  undefined1 local_38 [7];
  value_type item;
  uniform_int_distribution<unsigned_long> uniform;
  default_random_engine engine;
  vector<signed_char,_std::allocator<signed_char>_> *c_local;
  single_fn *this_local;
  
  sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(c);
  if (1 < sVar2) {
    this_00 = std::__shared_ptr_access<std::random_device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::random_device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    rVar1 = std::random_device::operator()(this_00);
    std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
    linear_congruential_engine
              ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               &uniform._M_param._M_b,(ulong)rVar1);
    sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(c);
    std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
              ((uniform_int_distribution<unsigned_long> *)local_38,0,sVar2 - 1);
    __n = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)local_38,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     &uniform._M_param._M_b);
    pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](c,__n);
    local_39 = *pvVar3;
    __first = std::vector<signed_char,_std::allocator<signed_char>_>::begin(c);
    __last = std::vector<signed_char,_std::allocator<signed_char>_>::end(c);
    std::
    fill<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,signed_char>
              ((__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                )__first._M_current,
               (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                )__last._M_current,&local_39);
  }
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(__return_storage_ptr__,c);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c)
    {
        if (c.size() > 1)
        {
            std::default_random_engine engine((*rd)());
            using size_type = typename Container::size_type;
            auto uniform = std::uniform_int_distribution<size_type>(0, c.size() - 1);
            auto item = c[uniform(engine)];
            std::fill(c.begin(), c.end(), item);
        }
        return c;
    }